

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O0

void __thiscall
GdlSlotRefExpression::LookupExpCheck(GdlSlotRefExpression *this,bool param_2,Symbol psymFeature)

{
  byte bVar1;
  string *in_RDX;
  byte in_SIL;
  undefined8 in_RDI;
  GrcErrorList *unaff_retaddr;
  allocator local_39;
  string local_38 [32];
  undefined7 in_stack_fffffffffffffff0;
  int nID;
  
  nID = (int)((ulong)in_RDI >> 0x20);
  bVar1 = in_SIL & 1;
  if (in_RDX != (string *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"Setting feature to a slot reference",&local_39);
    GrcErrorList::AddError
              (unaff_retaddr,nID,(GdlObject *)CONCAT17(bVar1,in_stack_fffffffffffffff0),in_RDX);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  return;
}

Assistant:

void GdlSlotRefExpression::LookupExpCheck(bool /*fInIf*/, Symbol psymFeature)
{
	if (psymFeature)
	{
		g_errorList.AddError(2166, this,
			"Setting feature to a slot reference");
	}
}